

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

void Tas_ManAssign(Tas_Man_t *p,Gia_Obj_t *pObj,int Level,Gia_Obj_t *pRes0,Gia_Obj_t *pRes1)

{
  Vec_Int_t *p_00;
  int iVar1;
  Gia_Obj_t *pObj_00;
  int local_68;
  int local_58;
  Gia_Obj_t *pObjR;
  Gia_Obj_t *pRes1_local;
  Gia_Obj_t *pRes0_local;
  int Level_local;
  Gia_Obj_t *pObj_local;
  Tas_Man_t *p_local;
  
  pObj_00 = Gia_Regular(pObj);
  iVar1 = Gia_ObjIsCand(pObj_00);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x291,
                  "void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Tas_VarIsAssigned(pObj_00);
  if (iVar1 != 0) {
    __assert_fail("!Tas_VarIsAssigned(pObjR)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x292,
                  "void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  Tas_VarAssign(pObj_00);
  iVar1 = Gia_IsComplement(pObj);
  Tas_VarSetValue(pObj_00,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  if (pObj_00->Value != 0xffffffff) {
    __assert_fail("pObjR->Value == ~0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x295,
                  "void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pObj_00->Value = (p->pProp).iTail;
  Tas_QuePush(&p->pProp,pObj_00);
  Vec_IntPush(p->vLevReas,Level);
  if ((pRes0 == (Gia_Obj_t *)0x0) && (pRes1 != (Gia_Obj_t *)0x0)) {
    Vec_IntPush(p->vLevReas,0);
    p_00 = p->vLevReas;
    iVar1 = Tas_ClsHandle(p,(Tas_Cls_t *)pRes1);
    Vec_IntPush(p_00,iVar1);
  }
  else {
    if (pRes0 == (Gia_Obj_t *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = (int)(((long)pRes0 - (long)pObj_00) / 0xc);
    }
    Vec_IntPush(p->vLevReas,local_58);
    if (pRes1 == (Gia_Obj_t *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = (int)(((long)pRes1 - (long)pObj_00) / 0xc);
    }
    Vec_IntPush(p->vLevReas,local_68);
  }
  iVar1 = Vec_IntSize(p->vLevReas);
  if (iVar1 == (p->pProp).iTail * 3) {
    s_Counter2 = s_Counter2 + 1;
    return;
  }
  __assert_fail("Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                ,0x2a3,"void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)"
               );
}

Assistant:

static inline void Tas_ManAssign( Tas_Man_t * p, Gia_Obj_t * pObj, int Level, Gia_Obj_t * pRes0, Gia_Obj_t * pRes1 )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Tas_VarIsAssigned(pObjR) );
    Tas_VarAssign( pObjR );
    Tas_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    assert( pObjR->Value == ~0 );
    pObjR->Value = p->pProp.iTail;
    Tas_QuePush( &p->pProp, pObjR );
    Vec_IntPush( p->vLevReas, Level );
    if ( pRes0 == NULL && pRes1 != 0 ) // clause
    {
        Vec_IntPush( p->vLevReas, 0 );
        Vec_IntPush( p->vLevReas, Tas_ClsHandle( p, (Tas_Cls_t *)pRes1 ) );
    }
    else
    {
        Vec_IntPush( p->vLevReas, pRes0 ? pRes0-pObjR : 0 );
        Vec_IntPush( p->vLevReas, pRes1 ? pRes1-pObjR : 0 );
    }
    assert( Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail );
    s_Counter2++;
}